

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

GLuint deqp::gls::MultiTextureSamplerTest::createTexture3D(Functions *gl,int id)

{
  GLuint GVar1;
  GLenum GVar2;
  GLuint texture;
  Vec4 local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  Texture3D refTexture;
  
  texture = 0xffffffff;
  local_98.m_data[0] = 1.12104e-44;
  local_98.m_data[1] = 4.2039e-45;
  tcu::Texture3D::Texture3D(&refTexture,(TextureFormat *)&local_98,0x20,0x20,0x20);
  tcu::Texture3D::allocLevel(&refTexture,0);
  (*gl->genTextures)(1,&texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenTextures(1, &texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x39b);
  if (id == 0) {
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    local_88 = (undefined1 *)0x3f8000003f800000;
    puStack_80 = &DAT_3f0000003f000000;
    tcu::fillWithComponentGradients
              (refTexture.super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_98,(Vec4 *)&local_88);
  }
  else if (id == 1) {
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
    local_88 = &DAT_3f0000003f000000;
    puStack_80 = (undefined1 *)0x3f8000003f800000;
    tcu::fillWithComponentGradients
              (refTexture.super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_98,(Vec4 *)&local_88);
  }
  (*gl->bindTexture)(0x806f,texture);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_3D, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3ac);
  (*gl->texImage3D)(0x806f,0,0x8058,refTexture.m_width,refTexture.m_height,refTexture.m_depth,0,
                    0x1908,0x1401,
                    ((refTexture.super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                    m_data);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,
                  "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3af);
  (*gl->generateMipmap)(0x806f);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glGenerateMipmap(GL_TEXTURE_3D)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3b2);
  (*gl->bindTexture)(0x806f,0);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"glBindTexture(GL_TEXTURE_3D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x3b5);
  GVar1 = texture;
  tcu::Texture3D::~Texture3D(&refTexture);
  return GVar1;
}

Assistant:

GLuint MultiTextureSamplerTest::createTexture3D (const glw::Functions& gl, int id)
{
	GLuint			texture		= (GLuint)-1;
	tcu::Texture3D	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), TEXTURE3D_WIDTH, TEXTURE3D_HEIGHT, TEXTURE3D_DEPTH);

	refTexture.allocLevel(0);

	gl.genTextures(1, &texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures(1, &texture)");

	switch (id)
	{
		case 0:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 0.5f, 0.5f));
			break;

		case 1:
			tcu::fillWithComponentGradients(refTexture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f));
			break;

		default:
			DE_ASSERT(false);
	}

	gl.bindTexture(GL_TEXTURE_3D, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_3D, texture)");

	gl.texImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, refTexture.getWidth(), refTexture.getHeight(), refTexture.getDepth(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevel(0).getDataPtr())");

	gl.generateMipmap(GL_TEXTURE_3D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_3D)");

	gl.bindTexture(GL_TEXTURE_3D, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_3D, 0)");

	return texture;
}